

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O0

void __thiscall toml::detail::location::advance(location *this,size_t n)

{
  long lVar1;
  element_type *peVar2;
  size_type sVar3;
  long in_RSI;
  size_t in_RDI;
  location *unaff_retaddr;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  peVar2 = CLI::std::
           __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1fbbfb);
  sVar3 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(peVar2);
  if ((ulong)(lVar1 + in_RSI) < sVar3) {
    advance_impl(unaff_retaddr,in_RDI);
  }
  else {
    peVar2 = CLI::std::
             __shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fbc2d);
    CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(peVar2);
    advance_impl(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

TOML11_INLINE void location::advance(std::size_t n) noexcept
{
    assert(this->is_ok());
    if(this->location_ + n < this->source_->size())
    {
        this->advance_impl(n);
    }
    else
    {
        this->advance_impl(this->source_->size() - this->location_);

        assert(this->location_ == this->source_->size());
    }
}